

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O0

POST * __thiscall minihttp::POST::add(POST *this,char *key,char *value)

{
  char *pcVar1;
  bool bVar2;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *value_local;
  char *key_local;
  POST *this_local;
  
  local_20 = value;
  value_local = key;
  key_local = (char *)this;
  bVar2 = empty(this);
  if (!bVar2) {
    std::__cxx11::string::operator+=((string *)this,'&');
  }
  pcVar1 = value_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,pcVar1,&local_41);
  URLEncode(&local_40,&this->data);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  std::__cxx11::string::operator+=((string *)this,'=');
  pcVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,pcVar1,&local_79);
  URLEncode(&local_78,&this->data);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  return this;
}

Assistant:

POST& POST::add(const char *key, const char *value)
{
    if(!empty())
        data += '&';
    URLEncode(key, data);
    data += '=';
    URLEncode(value, data);
    return *this;
}